

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O0

int check_trust(X509_STORE_CTX *ctx)

{
  int iVar1;
  size_t sVar2;
  X509 *pXVar3;
  X509 *p;
  X509 *mx;
  ulong uStack_28;
  int trust;
  size_t i;
  X509 *x;
  X509_STORE_CTX *ctx_local;
  
  for (uStack_28 = (ulong)ctx->last_untrusted; sVar2 = sk_X509_num(ctx->chain), uStack_28 < sVar2;
      uStack_28 = uStack_28 + 1) {
    pXVar3 = (X509 *)sk_X509_value(ctx->chain,uStack_28);
    iVar1 = X509_check_trust(pXVar3,ctx->param->trust,0);
    if (iVar1 == 1) {
      return 1;
    }
    if (iVar1 == 2) {
      ctx->error_depth = (int)uStack_28;
      ctx->current_cert = (X509 *)pXVar3;
      ctx->error = 0x1c;
      iVar1 = call_verify_cb(0,ctx);
      if (iVar1 == 0) {
        return 2;
      }
    }
  }
  if ((ctx->param->flags & 0x80000) != 0) {
    iVar1 = ctx->last_untrusted;
    sVar2 = sk_X509_num(ctx->chain);
    if (iVar1 < (int)sVar2) {
      return 1;
    }
    pXVar3 = (X509 *)sk_X509_value(ctx->chain,0);
    p = lookup_cert_match(ctx,(X509 *)pXVar3);
    if (p != (X509 *)0x0) {
      sk_X509_set(ctx->chain,0,p);
      X509_free(pXVar3);
      ctx->last_untrusted = 0;
      return 1;
    }
  }
  return 3;
}

Assistant:

static int check_trust(X509_STORE_CTX *ctx) {
  X509 *x = NULL;
  // Check all trusted certificates in chain
  for (size_t i = ctx->last_untrusted; i < sk_X509_num(ctx->chain); i++) {
    x = sk_X509_value(ctx->chain, i);
    int trust = X509_check_trust(x, ctx->param->trust, 0);
    // If explicitly trusted return trusted
    if (trust == X509_TRUST_TRUSTED) {
      return X509_TRUST_TRUSTED;
    }
    // If explicitly rejected notify callback and reject if not
    // overridden.
    if (trust == X509_TRUST_REJECTED) {
      ctx->error_depth = (int)i;
      ctx->current_cert = x;
      ctx->error = X509_V_ERR_CERT_REJECTED;
      if (!call_verify_cb(0, ctx)) {
        return X509_TRUST_REJECTED;
      }
    }
  }
  // If we accept partial chains and have at least one trusted certificate
  // return success.
  if (ctx->param->flags & X509_V_FLAG_PARTIAL_CHAIN) {
    X509 *mx;
    if (ctx->last_untrusted < (int)sk_X509_num(ctx->chain)) {
      return X509_TRUST_TRUSTED;
    }
    x = sk_X509_value(ctx->chain, 0);
    mx = lookup_cert_match(ctx, x);
    if (mx) {
      (void)sk_X509_set(ctx->chain, 0, mx);
      X509_free(x);
      ctx->last_untrusted = 0;
      return X509_TRUST_TRUSTED;
    }
  }

  // If no trusted certs in chain at all return untrusted and allow
  // standard (no issuer cert) etc errors to be indicated.
  return X509_TRUST_UNTRUSTED;
}